

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool __thiscall QDir::removeRecursively(QDir *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Permissions PVar4;
  QDirPrivate *this_00;
  undefined1 uVar5;
  long in_FS_OFFSET;
  QDir QStack_88;
  QArrayDataPointer<char16_t> local_80;
  DirEntry local_68;
  QDirListing local_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QSharedDataPointer<QDirPrivate>::operator->(&this->d_ptr);
  bVar1 = QDirPrivate::exists(this_00);
  uVar5 = 1;
  if (bVar1) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    path((QString *)&local_58,this);
    QDirListing::QDirListing(&local_60,(QString *)&local_58,(IteratorFlags)0x40);
    local_68.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_60);
    bVar1 = true;
    for (; local_68.dirListPtr != (QDirListingPrivate *)0x0; local_68 = QDirListing::next(local_68))
    {
      QDirListing::DirEntry::filePath((QString *)&local_80,&local_68);
      bVar2 = QDirListing::DirEntry::isDir(&local_68);
      if ((!bVar2) || (bVar2 = QDirListing::DirEntry::isSymLink(&local_68), bVar2)) {
        iVar3 = QFile::remove((char *)&local_80);
        if (((char)iVar3 == '\0') &&
           (((PVar4 = QFile::permissions((QString *)&local_80),
             ((uint)PVar4.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                    super_QFlagsStorage<QFileDevice::Permission>.i >> 9 & 1) != 0 ||
             (bVar2 = QFile::setPermissions
                                ((QString *)&local_80,
                                 (Permissions)
                                 ((uint)PVar4.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                                        super_QFlagsStorage<QFileDevice::Permission>.i | 0x200)),
             !bVar2)) || (iVar3 = QFile::remove((char *)&local_80), (char)iVar3 == '\0'))))
        goto LAB_002138fc;
      }
      else {
        QDir(&QStack_88,(QString *)&local_80);
        bVar2 = removeRecursively(&QStack_88);
        ~QDir(&QStack_88);
        if (!bVar2) {
LAB_002138fc:
          bVar1 = false;
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    }
    QDirListing::~QDirListing(&local_60);
    if (bVar1) {
      absolutePath((QString *)&local_80,this);
      iVar3 = rmdir(this,(char *)&local_80);
      uVar5 = (undefined1)iVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    }
    else {
      uVar5 = 0;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar5;
}

Assistant:

bool QDir::removeRecursively()
{
    if (!d_ptr->exists())
        return true;

    bool success = true;
    const QString dirPath = path();
    // not empty -- we must empty it first
    for (const auto &dirEntry : QDirListing(dirPath, QDirListing::IteratorFlag::IncludeHidden)) {
        const QString &filePath = dirEntry.filePath();
        bool ok;
        if (dirEntry.isDir() && !dirEntry.isSymLink()) {
            ok = QDir(filePath).removeRecursively(); // recursive
        } else {
            ok = QFile::remove(filePath);
            if (!ok) { // Read-only files prevent directory deletion on Windows, retry with Write permission.
                const QFile::Permissions permissions = QFile::permissions(filePath);
                if (!(permissions & QFile::WriteUser))
                    ok = QFile::setPermissions(filePath, permissions | QFile::WriteUser)
                        && QFile::remove(filePath);
            }
        }
        if (!ok)
            success = false;
    }

    if (success)
        success = rmdir(absolutePath());

    return success;
}